

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O2

void Transform(uint32_t *s,uint32_t *chunk,size_t blocks)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint32_t auVar5 [4];
  uint32_t auVar6 [4];
  uint32_t auVar7 [4];
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  uint uVar13;
  long lVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t uVar23;
  uint32_t *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar63;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  uint uVar66;
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar71;
  uint uVar72;
  undefined1 auVar69 [16];
  uint uVar73;
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint32_t local_150;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  ulong local_130;
  uint32_t local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  auVar7 = TransformSSE4::SHUF_DC00;
  auVar6 = TransformSSE4::SHUF_00BA;
  auVar5 = TransformSSE4::FLIP_MASK;
  local_38 = blocks;
  local_60 = s;
  if (use_optimized_transform == '\x01') {
    if ((blocks & 0x3ffffffffffffff) != 0) {
      pauVar11 = (undefined1 (*) [16])(chunk + blocks * 0x10);
      uVar21 = *s;
      uVar20 = s[1];
      uVar15 = s[2];
      uVar16 = s[3];
      uVar10 = s[4];
      uVar19 = s[5];
      uVar23 = s[6];
      uVar13 = s[7];
      do {
        puVar24 = TransformSSE4::K256;
        auVar61 = pshufb(*(undefined1 (*) [16])chunk,(undefined1  [16])auVar5);
        auVar64 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x10),(undefined1  [16])auVar5);
        auVar67 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x20),(undefined1  [16])auVar5);
        auVar69 = pshufb(*(undefined1 (*) [16])((long)chunk + 0x30),(undefined1  [16])auVar5);
        lVar14 = 3;
        do {
          uVar26 = auVar61._4_4_;
          uVar38 = auVar61._8_4_;
          uVar63 = auVar61._12_4_;
          uVar25 = (uVar10 >> 0xe | uVar10 << 0x12) ^ uVar10;
          uVar28 = (uVar21 >> 9 | uVar21 << 0x17) ^ uVar21;
          uVar34 = auVar67._4_4_;
          uVar32 = auVar67._8_4_;
          uVar35 = auVar67._12_4_;
          uVar36 = auVar69._0_4_;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar10;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar21;
          iVar12 = uVar13 + ((uVar19 ^ uVar23) & uVar10 ^ uVar23) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            *puVar24 + auVar61._0_4_;
          uVar37 = auVar64._0_4_;
          uVar27 = uVar16 + iVar12;
          uVar13 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar21 | uVar15) & uVar20 | uVar21 & uVar15);
          uVar25 = (uVar27 >> 0xe | uVar27 * 0x40000) ^ uVar27;
          uVar28 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar27;
          uVar29 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar13;
          iVar12 = uVar23 + ((uVar10 ^ uVar19) & uVar27 ^ uVar19) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[1] + uVar26;
          uVar28 = uVar15 + iVar12;
          uVar71 = auVar69._4_4_;
          uVar72 = auVar69._8_4_;
          uVar73 = auVar69._12_4_;
          auVar75._0_8_ = CONCAT44(uVar72,uVar72);
          auVar75._8_4_ = uVar73;
          auVar75._12_4_ = uVar73;
          uVar22 = iVar12 + (uVar29 >> 2 | uVar29 << 0x1e) +
                   ((uVar13 | uVar20) & uVar21 | uVar13 & uVar20);
          uVar25 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          uVar29 = (uVar22 >> 9 | uVar22 * 0x800000) ^ uVar22;
          auVar79._0_8_ = auVar75._0_8_ >> 0x11;
          auVar79._8_8_ = auVar75._8_8_ >> 0x11;
          auVar53._0_8_ = auVar75._0_8_ >> 0x13;
          auVar53._8_8_ = auVar75._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar28;
          auVar74._0_4_ = uVar72 >> 10;
          auVar74._4_4_ = uVar72 >> 10;
          auVar74._8_4_ = uVar73 >> 10;
          auVar74._12_4_ = uVar73 >> 10;
          uVar29 = (uVar29 >> 0xb | uVar29 << 0x15) ^ uVar22;
          iVar12 = uVar19 + ((uVar27 ^ uVar10) & uVar28 ^ uVar10) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[2] + uVar38;
          auVar75 = pshufb(auVar74 ^ auVar79 ^ auVar53,(undefined1  [16])auVar6);
          uVar20 = uVar20 + iVar12;
          uVar31 = uVar34 + auVar61._0_4_ +
                   ((uVar26 << 0x19 | uVar26 >> 7) ^ uVar26 << 0xe ^ uVar26 >> 0x12 ^ uVar26 >> 3) +
                   auVar75._0_4_;
          uVar33 = uVar32 + uVar26 +
                   ((uVar38 << 0x19 | uVar38 >> 7) ^ uVar38 << 0xe ^ uVar38 >> 0x12 ^ uVar38 >> 3) +
                   auVar75._4_4_;
          auVar39._0_8_ = CONCAT44(uVar31,uVar31);
          auVar39._8_4_ = uVar33;
          auVar39._12_4_ = uVar33;
          uVar29 = iVar12 + (uVar29 >> 2 | uVar29 << 0x1e) +
                   ((uVar22 | uVar21) & uVar13 | uVar22 & uVar21);
          uVar25 = (uVar20 >> 0xe | uVar20 * 0x40000) ^ uVar20;
          auVar40._0_8_ = auVar39._0_8_ >> 0x11;
          auVar40._8_8_ = auVar39._8_8_ >> 0x11;
          uVar26 = (uVar29 >> 9 | uVar29 * 0x800000) ^ uVar29;
          auVar54._0_8_ = auVar39._0_8_ >> 0x13;
          auVar54._8_8_ = auVar39._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar20;
          auVar62._0_4_ = uVar31 >> 10;
          auVar62._4_4_ = uVar31 >> 10;
          auVar62._8_4_ = uVar33 >> 10;
          auVar62._12_4_ = uVar33 >> 10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar29;
          iVar12 = uVar10 + ((uVar28 ^ uVar27) & uVar20 ^ uVar27) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[3] + uVar63;
          auVar69 = pshufb(auVar62 ^ auVar40 ^ auVar54,(undefined1  [16])auVar7);
          uVar21 = uVar21 + iVar12;
          auVar61._0_4_ = auVar69._0_4_ + uVar31;
          auVar61._4_4_ = auVar69._4_4_ + uVar33;
          auVar61._8_4_ =
               auVar69._8_4_ +
               uVar35 + uVar38 +
               ((uVar63 << 0x19 | uVar63 >> 7) ^ uVar63 << 0xe ^ uVar63 >> 0x12 ^ uVar63 >> 3) +
               auVar75._8_4_;
          auVar61._12_4_ =
               auVar69._12_4_ +
               uVar36 + uVar63 +
               ((uVar37 << 0x19 | uVar37 >> 7) ^ uVar37 << 0xe ^ uVar37 >> 0x12 ^ uVar37 >> 3) +
               auVar75._12_4_;
          uVar10 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar29 | uVar13) & uVar22 | uVar29 & uVar13);
          uVar33 = auVar64._4_4_;
          uVar63 = auVar64._8_4_;
          uVar66 = auVar64._12_4_;
          uVar25 = (uVar21 >> 0xe | uVar21 * 0x40000) ^ uVar21;
          uVar26 = (uVar10 >> 9 | uVar10 * 0x800000) ^ uVar10;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar21;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar10;
          iVar12 = uVar27 + ((uVar20 ^ uVar28) & uVar21 ^ uVar28) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[4] + uVar37;
          uVar38 = auVar67._0_4_;
          uVar13 = uVar13 + iVar12;
          uVar27 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar10 | uVar22) & uVar29 | uVar10 & uVar22);
          uVar25 = (uVar13 >> 0xe | uVar13 * 0x40000) ^ uVar13;
          uVar26 = (uVar27 >> 9 | uVar27 * 0x800000) ^ uVar27;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar13;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar27;
          iVar12 = uVar28 + ((uVar21 ^ uVar20) & uVar13 ^ uVar20) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[5] + uVar33;
          uVar22 = uVar22 + iVar12;
          auVar41._0_8_ = CONCAT44(auVar61._8_4_,auVar61._8_4_);
          auVar41._8_4_ = auVar61._12_4_;
          auVar41._12_4_ = auVar61._12_4_;
          uVar28 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar27 | uVar29) & uVar10 | uVar27 & uVar29);
          uVar25 = (uVar22 >> 0xe | uVar22 * 0x40000) ^ uVar22;
          uVar26 = (uVar28 >> 9 | uVar28 * 0x800000) ^ uVar28;
          auVar42._0_8_ = auVar41._0_8_ >> 0x11;
          auVar42._8_8_ = auVar41._8_8_ >> 0x11;
          auVar55._0_8_ = auVar41._0_8_ >> 0x13;
          auVar55._8_8_ = auVar41._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar22;
          auVar76._0_4_ = auVar61._8_4_ >> 10;
          auVar76._4_4_ = auVar61._8_4_ >> 10;
          auVar76._8_4_ = auVar61._12_4_ >> 10;
          auVar76._12_4_ = auVar61._12_4_ >> 10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar28;
          iVar12 = uVar20 + ((uVar13 ^ uVar21) & uVar22 ^ uVar21) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[6] + uVar63;
          auVar69 = pshufb(auVar76 ^ auVar42 ^ auVar55,(undefined1  [16])auVar6);
          uVar29 = uVar29 + iVar12;
          uVar31 = uVar71 + uVar37 +
                   ((uVar33 << 0x19 | uVar33 >> 7) ^ uVar33 << 0xe ^ uVar33 >> 0x12 ^ uVar33 >> 3) +
                   auVar69._0_4_;
          uVar33 = uVar72 + uVar33 +
                   ((uVar63 << 0x19 | uVar63 >> 7) ^ uVar63 << 0xe ^ uVar63 >> 0x12 ^ uVar63 >> 3) +
                   auVar69._4_4_;
          auVar43._0_8_ = CONCAT44(uVar31,uVar31);
          auVar43._8_4_ = uVar33;
          auVar43._12_4_ = uVar33;
          uVar20 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar28 | uVar10) & uVar27 | uVar28 & uVar10);
          uVar25 = (uVar29 >> 0xe | uVar29 * 0x40000) ^ uVar29;
          auVar44._0_8_ = auVar43._0_8_ >> 0x11;
          auVar44._8_8_ = auVar43._8_8_ >> 0x11;
          uVar26 = (uVar20 >> 9 | uVar20 * 0x800000) ^ uVar20;
          auVar56._0_8_ = auVar43._0_8_ >> 0x13;
          auVar56._8_8_ = auVar43._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar29;
          auVar65._0_4_ = uVar31 >> 10;
          auVar65._4_4_ = uVar31 >> 10;
          auVar65._8_4_ = uVar33 >> 10;
          auVar65._12_4_ = uVar33 >> 10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar20;
          iVar12 = uVar21 + ((uVar22 ^ uVar13) & uVar29 ^ uVar13) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[7] + uVar66;
          auVar67 = pshufb(auVar65 ^ auVar44 ^ auVar56,(undefined1  [16])auVar7);
          uVar10 = uVar10 + iVar12;
          auVar64._0_4_ = auVar67._0_4_ + uVar31;
          auVar64._4_4_ = auVar67._4_4_ + uVar33;
          auVar64._8_4_ =
               auVar67._8_4_ +
               uVar73 + uVar63 +
               ((uVar66 << 0x19 | uVar66 >> 7) ^ uVar66 << 0xe ^ uVar66 >> 0x12 ^ uVar66 >> 3) +
               auVar69._8_4_;
          auVar64._12_4_ =
               auVar67._12_4_ +
               auVar61._0_4_ + uVar66 +
               ((uVar38 << 0x19 | uVar38 >> 7) ^ uVar38 << 0xe ^ uVar38 >> 0x12 ^ uVar38 >> 3) +
               auVar69._12_4_;
          uVar21 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar20 | uVar27) & uVar28 | uVar20 & uVar27);
          uVar25 = (uVar10 >> 0xe | uVar10 * 0x40000) ^ uVar10;
          uVar26 = (uVar21 >> 9 | uVar21 * 0x800000) ^ uVar21;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar21;
          iVar12 = uVar13 + ((uVar29 ^ uVar22) & uVar10 ^ uVar22) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[8] + uVar38;
          uVar27 = uVar27 + iVar12;
          uVar13 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar21 | uVar28) & uVar20 | uVar21 & uVar28);
          uVar25 = (uVar27 >> 0xe | uVar27 * 0x40000) ^ uVar27;
          uVar26 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar27;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar13;
          iVar12 = uVar22 + ((uVar10 ^ uVar29) & uVar27 ^ uVar29) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[9] + uVar34;
          uVar28 = uVar28 + iVar12;
          auVar45._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
          auVar45._8_4_ = auVar64._12_4_;
          auVar45._12_4_ = auVar64._12_4_;
          uVar22 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar13 | uVar20) & uVar21 | uVar13 & uVar20);
          uVar25 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          uVar26 = (uVar22 >> 9 | uVar22 * 0x800000) ^ uVar22;
          auVar46._0_8_ = auVar45._0_8_ >> 0x11;
          auVar46._8_8_ = auVar45._8_8_ >> 0x11;
          auVar57._0_8_ = auVar45._0_8_ >> 0x13;
          auVar57._8_8_ = auVar45._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar28;
          auVar77._0_4_ = auVar64._8_4_ >> 10;
          auVar77._4_4_ = auVar64._8_4_ >> 10;
          auVar77._8_4_ = auVar64._12_4_ >> 10;
          auVar77._12_4_ = auVar64._12_4_ >> 10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar22;
          iVar12 = uVar29 + ((uVar27 ^ uVar10) & uVar28 ^ uVar10) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[10] + uVar32;
          auVar75 = pshufb(auVar77 ^ auVar46 ^ auVar57,(undefined1  [16])auVar6);
          uVar20 = uVar20 + iVar12;
          uVar31 = auVar61._4_4_ + uVar38 +
                   ((uVar34 << 0x19 | uVar34 >> 7) ^ uVar34 << 0xe ^ uVar34 >> 0x12 ^ uVar34 >> 3) +
                   auVar75._0_4_;
          uVar34 = auVar61._8_4_ + uVar34 +
                   ((uVar32 << 0x19 | uVar32 >> 7) ^ uVar32 << 0xe ^ uVar32 >> 0x12 ^ uVar32 >> 3) +
                   auVar75._4_4_;
          auVar47._0_8_ = CONCAT44(uVar31,uVar31);
          auVar47._8_4_ = uVar34;
          auVar47._12_4_ = uVar34;
          uVar29 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar22 | uVar21) & uVar13 | uVar22 & uVar21);
          uVar25 = (uVar20 >> 0xe | uVar20 * 0x40000) ^ uVar20;
          auVar48._0_8_ = auVar47._0_8_ >> 0x11;
          auVar48._8_8_ = auVar47._8_8_ >> 0x11;
          uVar26 = (uVar29 >> 9 | uVar29 * 0x800000) ^ uVar29;
          auVar58._0_8_ = auVar47._0_8_ >> 0x13;
          auVar58._8_8_ = auVar47._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar20;
          auVar68._0_4_ = uVar31 >> 10;
          auVar68._4_4_ = uVar31 >> 10;
          auVar68._8_4_ = uVar34 >> 10;
          auVar68._12_4_ = uVar34 >> 10;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar29;
          iVar12 = uVar10 + ((uVar28 ^ uVar27) & uVar20 ^ uVar27) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            puVar24[0xb] + uVar35;
          auVar69 = pshufb(auVar68 ^ auVar48 ^ auVar58,(undefined1  [16])auVar7);
          uVar21 = uVar21 + iVar12;
          auVar67._0_4_ = auVar69._0_4_ + uVar31;
          auVar67._4_4_ = auVar69._4_4_ + uVar34;
          auVar67._8_4_ =
               auVar69._8_4_ +
               auVar61._12_4_ + uVar32 +
               ((uVar35 << 0x19 | uVar35 >> 7) ^ uVar35 << 0xe ^ uVar35 >> 0x12 ^ uVar35 >> 3) +
               auVar75._8_4_;
          auVar67._12_4_ =
               auVar69._12_4_ +
               auVar64._0_4_ + uVar35 +
               ((uVar36 << 0x19 | uVar36 >> 7) ^ uVar36 << 0xe ^ uVar36 >> 0x12 ^ uVar36 >> 3) +
               auVar75._12_4_;
          uVar10 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar29 | uVar13) & uVar22 | uVar29 & uVar13);
          puVar1 = puVar24 + 0xc;
          puVar2 = puVar24 + 0xd;
          puVar3 = puVar24 + 0xe;
          puVar4 = puVar24 + 0xf;
          puVar24 = puVar24 + 0x10;
          uVar25 = (uVar21 >> 0xe | uVar21 * 0x40000) ^ uVar21;
          uVar26 = (uVar10 >> 9 | uVar10 * 0x800000) ^ uVar10;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar21;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar10;
          iVar12 = uVar27 + ((uVar20 ^ uVar28) & uVar21 ^ uVar28) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            *puVar1 + uVar36;
          uVar13 = uVar13 + iVar12;
          uVar16 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar10 | uVar22) & uVar29 | uVar10 & uVar22);
          uVar25 = (uVar13 >> 0xe | uVar13 * 0x40000) ^ uVar13;
          uVar27 = (uVar16 >> 9 | uVar16 * 0x800000) ^ uVar16;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar13;
          uVar27 = (uVar27 >> 0xb | uVar27 << 0x15) ^ uVar16;
          iVar12 = uVar28 + ((uVar21 ^ uVar20) & uVar13 ^ uVar20) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            *puVar2 + uVar71;
          uVar23 = uVar22 + iVar12;
          auVar49._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
          auVar49._8_4_ = auVar67._12_4_;
          auVar49._12_4_ = auVar67._12_4_;
          uVar15 = iVar12 + (uVar27 >> 2 | uVar27 << 0x1e) +
                   ((uVar16 | uVar29) & uVar10 | uVar16 & uVar29);
          uVar25 = (uVar23 >> 0xe | uVar23 * 0x40000) ^ uVar23;
          uVar28 = (uVar15 >> 9 | uVar15 * 0x800000) ^ uVar15;
          auVar50._0_8_ = auVar49._0_8_ >> 0x11;
          auVar50._8_8_ = auVar49._8_8_ >> 0x11;
          auVar59._0_8_ = auVar49._0_8_ >> 0x13;
          auVar59._8_8_ = auVar49._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar23;
          auVar78._0_4_ = auVar67._8_4_ >> 10;
          auVar78._4_4_ = auVar67._8_4_ >> 10;
          auVar78._8_4_ = auVar67._12_4_ >> 10;
          auVar78._12_4_ = auVar67._12_4_ >> 10;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar15;
          iVar12 = uVar20 + ((uVar13 ^ uVar21) & uVar23 ^ uVar21) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            *puVar3 + uVar72;
          auVar79 = pshufb(auVar78 ^ auVar50 ^ auVar59,(undefined1  [16])auVar6);
          uVar19 = uVar29 + iVar12;
          uVar27 = auVar64._4_4_ + uVar36 +
                   ((uVar71 << 0x19 | uVar71 >> 7) ^ uVar71 << 0xe ^ uVar71 >> 0x12 ^ uVar71 >> 3) +
                   auVar79._0_4_;
          uVar29 = auVar64._8_4_ + uVar71 +
                   ((uVar72 << 0x19 | uVar72 >> 7) ^ uVar72 << 0xe ^ uVar72 >> 0x12 ^ uVar72 >> 3) +
                   auVar79._4_4_;
          auVar51._0_8_ = CONCAT44(uVar27,uVar27);
          auVar51._8_4_ = uVar29;
          auVar51._12_4_ = uVar29;
          uVar20 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar15 | uVar10) & uVar16 | uVar15 & uVar10);
          uVar25 = (uVar19 >> 0xe | uVar19 * 0x40000) ^ uVar19;
          auVar52._0_8_ = auVar51._0_8_ >> 0x11;
          auVar52._8_8_ = auVar51._8_8_ >> 0x11;
          uVar28 = (uVar20 >> 9 | uVar20 * 0x800000) ^ uVar20;
          auVar60._0_8_ = auVar51._0_8_ >> 0x13;
          auVar60._8_8_ = auVar51._8_8_ >> 0x13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar19;
          auVar70._0_4_ = uVar27 >> 10;
          auVar70._4_4_ = uVar27 >> 10;
          auVar70._8_4_ = uVar29 >> 10;
          auVar70._12_4_ = uVar29 >> 10;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar20;
          iVar12 = uVar21 + ((uVar23 ^ uVar13) & uVar19 ^ uVar13) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            *puVar4 + uVar73;
          auVar75 = pshufb(auVar70 ^ auVar52 ^ auVar60,(undefined1  [16])auVar7);
          uVar10 = uVar10 + iVar12;
          auVar69._0_4_ = auVar75._0_4_ + uVar27;
          auVar69._4_4_ = auVar75._4_4_ + uVar29;
          auVar69._8_4_ =
               auVar75._8_4_ +
               auVar64._12_4_ + uVar72 +
               ((uVar73 << 0x19 | uVar73 >> 7) ^ uVar73 << 0xe ^ uVar73 >> 0x12 ^ uVar73 >> 3) +
               auVar79._8_4_;
          auVar69._12_4_ =
               auVar75._12_4_ +
               auVar67._0_4_ + uVar73 +
               ((auVar61._0_4_ * 0x2000000 | auVar61._0_4_ >> 7) ^ auVar61._0_4_ * 0x4000 ^
                auVar61._0_4_ >> 0x12 ^ auVar61._0_4_ >> 3) + auVar79._12_4_;
          uVar21 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar20 | uVar16) & uVar15 | uVar20 & uVar16);
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        lVar14 = 2;
        do {
          uVar25 = (uVar10 >> 0xe | uVar10 << 0x12) ^ uVar10;
          uVar28 = (uVar21 >> 9 | uVar21 << 0x17) ^ uVar21;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar10;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar21;
          iVar12 = uVar13 + ((uVar19 ^ uVar23) & uVar10 ^ uVar23) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar61._0_4_ + *puVar24;
          uVar27 = uVar16 + iVar12;
          uVar13 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar21 | uVar15) & uVar20 | uVar21 & uVar15);
          uVar25 = (uVar27 >> 0xe | uVar27 * 0x40000) ^ uVar27;
          uVar28 = (uVar13 >> 9 | uVar13 * 0x800000) ^ uVar13;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar27;
          uVar29 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar13;
          iVar12 = uVar23 + ((uVar10 ^ uVar19) & uVar27 ^ uVar19) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar61._4_4_ + puVar24[1];
          uVar28 = uVar15 + iVar12;
          uVar22 = iVar12 + (uVar29 >> 2 | uVar29 << 0x1e) +
                   ((uVar13 | uVar20) & uVar21 | uVar13 & uVar20);
          uVar25 = (uVar28 >> 0xe | uVar28 * 0x40000) ^ uVar28;
          uVar29 = (uVar22 >> 9 | uVar22 * 0x800000) ^ uVar22;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar28;
          uVar29 = (uVar29 >> 0xb | uVar29 << 0x15) ^ uVar22;
          iVar12 = uVar19 + ((uVar27 ^ uVar10) & uVar28 ^ uVar10) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar61._8_4_ + puVar24[2];
          uVar20 = uVar20 + iVar12;
          uVar29 = iVar12 + (uVar29 >> 2 | uVar29 << 0x1e) +
                   ((uVar22 | uVar21) & uVar13 | uVar22 & uVar21);
          uVar25 = (uVar20 >> 0xe | uVar20 * 0x40000) ^ uVar20;
          uVar26 = (uVar29 >> 9 | uVar29 * 0x800000) ^ uVar29;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar20;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar29;
          iVar12 = uVar10 + ((uVar28 ^ uVar27) & uVar20 ^ uVar27) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar61._12_4_ + puVar24[3];
          uVar21 = uVar21 + iVar12;
          uVar10 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar29 | uVar13) & uVar22 | uVar29 & uVar13);
          puVar1 = puVar24 + 4;
          puVar2 = puVar24 + 5;
          puVar3 = puVar24 + 6;
          puVar4 = puVar24 + 7;
          puVar24 = puVar24 + 8;
          uVar25 = (uVar21 >> 0xe | uVar21 * 0x40000) ^ uVar21;
          uVar26 = (uVar10 >> 9 | uVar10 * 0x800000) ^ uVar10;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar21;
          uVar26 = (uVar26 >> 0xb | uVar26 << 0x15) ^ uVar10;
          iVar12 = uVar27 + ((uVar20 ^ uVar28) & uVar21 ^ uVar28) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar64._0_4_ + *puVar1;
          uVar13 = uVar13 + iVar12;
          uVar16 = iVar12 + (uVar26 >> 2 | uVar26 << 0x1e) +
                   ((uVar10 | uVar22) & uVar29 | uVar10 & uVar22);
          uVar25 = (uVar13 >> 0xe | uVar13 * 0x40000) ^ uVar13;
          uVar27 = (uVar16 >> 9 | uVar16 * 0x800000) ^ uVar16;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar13;
          uVar27 = (uVar27 >> 0xb | uVar27 << 0x15) ^ uVar16;
          iVar12 = uVar28 + ((uVar21 ^ uVar20) & uVar13 ^ uVar20) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar64._4_4_ + *puVar2;
          uVar23 = uVar22 + iVar12;
          uVar15 = iVar12 + (uVar27 >> 2 | uVar27 << 0x1e) +
                   ((uVar16 | uVar29) & uVar10 | uVar16 & uVar29);
          uVar25 = (uVar23 >> 0xe | uVar23 * 0x40000) ^ uVar23;
          uVar28 = (uVar15 >> 9 | uVar15 * 0x800000) ^ uVar15;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar23;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar15;
          iVar12 = uVar20 + ((uVar13 ^ uVar21) & uVar23 ^ uVar21) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar64._8_4_ + *puVar3;
          uVar19 = uVar29 + iVar12;
          uVar20 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar15 | uVar10) & uVar16 | uVar15 & uVar10);
          uVar25 = (uVar19 >> 0xe | uVar19 * 0x40000) ^ uVar19;
          uVar28 = (uVar20 >> 9 | uVar20 * 0x800000) ^ uVar20;
          uVar25 = (uVar25 >> 5 | uVar25 << 0x1b) ^ uVar19;
          uVar28 = (uVar28 >> 0xb | uVar28 << 0x15) ^ uVar20;
          iVar12 = uVar21 + ((uVar23 ^ uVar13) & uVar19 ^ uVar13) + (uVar25 >> 6 | uVar25 << 0x1a) +
                            auVar64._12_4_ + *puVar4;
          uVar10 = uVar10 + iVar12;
          uVar21 = iVar12 + (uVar28 >> 2 | uVar28 << 0x1e) +
                   ((uVar20 | uVar16) & uVar15 | uVar20 & uVar16);
          lVar14 = lVar14 + -1;
          auVar61 = auVar67;
          auVar64 = auVar69;
        } while (lVar14 != 0);
        uVar21 = uVar21 + *s;
        *s = uVar21;
        uVar20 = uVar20 + s[1];
        s[1] = uVar20;
        uVar15 = uVar15 + s[2];
        s[2] = uVar15;
        uVar16 = uVar16 + s[3];
        s[3] = uVar16;
        uVar10 = uVar10 + s[4];
        s[4] = uVar10;
        uVar19 = uVar19 + s[5];
        s[5] = uVar19;
        uVar23 = uVar23 + s[6];
        s[6] = uVar23;
        uVar13 = uVar13 + s[7];
        s[7] = uVar13;
        chunk = (uint32_t *)((long)chunk + 0x40);
      } while ((undefined1 (*) [16])chunk != pauVar11);
    }
    return;
  }
  while (bVar30 = local_38 != 0, local_38 = local_38 - 1, bVar30) {
    uVar15 = *local_60;
    uVar16 = local_60[1];
    c = local_60[2];
    d = local_60[3];
    uVar21 = local_60[4];
    uVar20 = local_60[5];
    local_48 = (ulong)uVar20;
    g = local_60[6];
    local_40 = (ulong)g;
    local_150 = local_60[7];
    uVar10 = *chunk;
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    local_b8 = (ulong)uVar10;
    f = uVar20;
    e = uVar21;
    b = uVar16;
    a = uVar15;
    local_e8 = chunk;
    local_70 = uVar16;
    local_6c = c;
    local_68 = d;
    local_64 = local_150;
    Round(uVar15,uVar16,c,&d,uVar21,uVar20,g,&local_150,0x428a2f98,uVar10);
    uVar18 = d;
    uVar19 = local_150;
    uVar10 = local_e8[1];
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    local_108 = (ulong)uVar10;
    local_74 = uVar15;
    local_50 = (ulong)uVar21;
    Round(local_150,uVar15,uVar16,&c,d,uVar21,uVar20,&g,0x71374491,uVar10);
    uVar17 = c;
    uVar16 = g;
    uVar20 = local_e8[2];
    uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
    local_100 = (ulong)uVar20;
    Round(g,uVar19,uVar15,&b,c,uVar18,uVar21,&f,0xb5c0fbcf,uVar20);
    uVar8 = b;
    uVar23 = f;
    uVar21 = local_e8[3];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_f0 = (ulong)uVar21;
    Round(f,uVar16,uVar19,&a,b,uVar17,uVar18,&e,0xe9b5dba5,uVar21);
    uVar9 = a;
    uVar19 = e;
    uVar21 = local_e8[4];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_d8 = (ulong)uVar21;
    Round(e,uVar23,uVar16,&local_150,a,uVar8,uVar17,&d,0x3956c25b,uVar21);
    uVar18 = d;
    uVar15 = local_150;
    uVar21 = local_e8[5];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_c0 = (ulong)uVar21;
    Round(d,uVar19,uVar23,&g,local_150,uVar9,uVar8,&c,0x59f111f1,uVar21);
    uVar17 = c;
    uVar16 = g;
    uVar21 = local_e8[6];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_f8 = (ulong)uVar21;
    Round(c,uVar18,uVar19,&f,g,uVar15,uVar9,&b,0x923f82a4,uVar21);
    uVar8 = b;
    uVar19 = f;
    uVar21 = local_e8[7];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_e0 = (ulong)uVar21;
    Round(b,uVar17,uVar18,&e,f,uVar16,uVar15,&a,0xab1c5ed5,uVar21);
    uVar9 = a;
    uVar23 = e;
    uVar21 = local_e8[8];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_d0 = (ulong)uVar21;
    Round(a,uVar8,uVar17,&d,e,uVar19,uVar16,&local_150,0xd807aa98,uVar21);
    uVar18 = d;
    uVar15 = local_150;
    uVar21 = local_e8[9];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_88 = (ulong)uVar21;
    Round(local_150,uVar9,uVar8,&c,d,uVar23,uVar19,&g,0x12835b01,uVar21);
    uVar17 = c;
    uVar16 = g;
    uVar21 = local_e8[10];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_98 = (ulong)uVar21;
    Round(g,uVar15,uVar9,&b,c,uVar18,uVar23,&f,0x243185be,uVar21);
    uVar8 = b;
    uVar19 = f;
    uVar21 = local_e8[0xb];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_a0 = (ulong)uVar21;
    Round(f,uVar16,uVar15,&a,b,uVar17,uVar18,&e,0x550c7dc3,uVar21);
    uVar9 = a;
    uVar23 = e;
    local_c8 = (ulong)a;
    uVar21 = local_e8[0xc];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_a8 = (ulong)uVar21;
    Round(e,uVar19,uVar16,&local_150,a,uVar8,uVar17,&d,0x72be5d74,uVar21);
    uVar18 = d;
    uVar15 = local_150;
    uVar21 = local_e8[0xd];
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    local_90 = (ulong)uVar21;
    Round(d,uVar23,uVar19,&g,local_150,uVar9,uVar8,&c,0x80deb1fe,uVar21);
    uVar17 = c;
    uVar16 = g;
    local_120 = (ulong)g;
    uVar21 = local_e8[0xe];
    uVar20 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8;
    uVar13 = uVar20 | uVar21 << 0x18;
    local_118._0_4_ = c;
    Round(c,uVar18,uVar23,&f,g,uVar15,(uint32_t)local_c8,&b,0x9bdc06a7,uVar13);
    uVar19 = f;
    local_124 = b;
    uVar21 = local_e8[0xf];
    uVar10 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8;
    uVar28 = uVar10 | uVar21 << 0x18;
    Round(b,uVar17,uVar18,&e,f,uVar16,uVar15,&a,0xc19bf174,uVar28);
    uVar18 = local_124;
    uVar23 = a;
    uVar15 = e;
    uVar21 = (uint)local_108;
    local_130 = (ulong)e;
    uVar25 = (int)local_b8 + (int)local_88 +
             ((uint)(local_108 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (uVar13 >> 10 ^ (uVar20 << 0xd | uVar13 >> 0x13) ^ (uVar20 << 0xf | uVar13 >> 0x11));
    local_110._0_4_ = a;
    local_b0 = (ulong)uVar13;
    Round(a,local_124,(uint32_t)local_118,&d,e,uVar19,(uint32_t)local_120,&local_150,0xe49b69c1,
          uVar25);
    uVar16 = d;
    local_120._0_4_ = local_150;
    uVar20 = (uint)local_100;
    uVar21 = (int)local_108 + (int)local_98 +
             ((uint)(local_100 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) +
             (uVar28 >> 10 ^ (uVar10 << 0xd | uVar28 >> 0x13) ^ (uVar10 << 0xf | uVar28 >> 0x11));
    local_c8 = (ulong)uVar28;
    Round(local_150,uVar23,uVar18,&c,d,uVar15,uVar19,&g,0xefbe4786,uVar21);
    uVar15 = (uint32_t)local_120;
    uVar19 = c;
    local_118._0_4_ = g;
    uVar13 = (uint)local_f0;
    uVar20 = uVar20 + (int)local_a0 +
             ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7)) +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    local_b8 = (ulong)uVar25;
    Round(g,(uint32_t)local_120,(uint32_t)local_110,&b,c,uVar16,(uint32_t)local_130,&f,0xfc19dc6,
          uVar20);
    uVar18 = (uint32_t)local_118;
    local_124 = f;
    uVar10 = (uint)local_d8;
    local_130 = (ulong)b;
    uVar10 = uVar13 + (int)local_a8 +
             ((uint)(local_d8 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_108 = (ulong)uVar21;
    Round(f,(uint32_t)local_118,uVar15,&a,b,uVar19,uVar16,&e,0x240ca1cc,uVar10);
    uVar23 = local_124;
    uVar15 = e;
    uVar21 = (uint)local_c0;
    local_80 = (ulong)a;
    uVar21 = (int)local_d8 + (int)local_90 +
             ((uint)(local_c0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_d8 = (ulong)uVar21;
    local_110 = CONCAT44(local_110._4_4_,e);
    uVar17 = (uint32_t)local_130;
    local_100 = (ulong)uVar20;
    Round(e,local_124,uVar18,&local_150,a,uVar17,uVar19,&d,0x2de92c6f,uVar21);
    uVar16 = d;
    uVar20 = (uint)local_f8;
    local_58 = (ulong)local_150;
    uVar13 = (int)local_c0 + (int)local_b0 +
             ((uint)(local_f8 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_120 = CONCAT44(local_120._4_4_,d);
    uVar18 = (uint32_t)local_80;
    local_f0 = (ulong)uVar10;
    Round(d,uVar15,uVar23,&g,local_150,uVar18,uVar17,&c,0x4a7484aa,uVar13);
    uVar19 = c;
    uVar15 = g;
    uVar21 = (uint)local_d8;
    uVar10 = (uint)local_e0;
    local_130 = (ulong)g;
    uVar21 = uVar20 + (int)local_c8 +
             ((uint)(local_e0 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) +
             ((uint)(local_d8 >> 10) & 0x3fffff ^
             (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11));
    local_118 = CONCAT44(local_118._4_4_,c);
    uVar17 = (uint32_t)local_58;
    Round(c,uVar16,(uint32_t)local_110,&f,g,uVar17,uVar18,&b,0x5cb0a9dc,uVar21);
    uVar23 = b;
    uVar16 = f;
    uVar20 = (uint)local_d0;
    local_110 = (ulong)f;
    uVar25 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_124 = b;
    local_c0 = (ulong)uVar13;
    Round(b,uVar19,(uint32_t)local_120,&e,f,uVar15,uVar17,&a,0x76f988da,uVar25);
    uVar17 = a;
    uVar19 = e;
    uVar10 = (uint)local_88;
    local_120 = (ulong)e;
    uVar20 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (uint32_t)local_d0
             + (int)local_108 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_f8 = (ulong)uVar21;
    Round(a,uVar23,(uint32_t)local_118,&d,e,uVar16,(uint32_t)local_130,&local_150,0x983e5152,uVar20)
    ;
    uVar23 = d;
    uVar15 = local_150;
    uVar21 = (uint)local_98;
    local_118 = (ulong)d;
    uVar13 = ((uint)(local_98 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + uVar10 +
             (uint32_t)local_100 +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    local_e0 = (ulong)uVar25;
    Round(local_150,uVar17,local_124,&c,d,uVar19,(uint32_t)local_110,&g,0xa831c66d,uVar13);
    uVar18 = c;
    uVar16 = g;
    uVar21 = (uint)local_a0;
    local_110 = (ulong)c;
    uVar10 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_98 +
             (int)local_f0 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_124 = g;
    local_d0 = (ulong)uVar20;
    Round(g,uVar15,uVar17,&b,c,uVar23,(uint32_t)local_120,&f,0xb00327c8,uVar10);
    uVar17 = b;
    uVar19 = f;
    uVar21 = (uint)local_a8;
    local_130 = (ulong)b;
    uVar21 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_a0 +
             (int)local_d8 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_88 = (ulong)uVar13;
    Round(f,uVar16,uVar15,&a,b,uVar18,(uint32_t)local_118,&e,0xbf597fc7,uVar21);
    uVar16 = a;
    uVar23 = e;
    uVar20 = (uint)local_90;
    local_118 = (ulong)a;
    uVar20 = ((uint)(local_90 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_a8 +
             (int)local_c0 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_98 = (ulong)uVar10;
    Round(e,uVar19,local_124,&local_150,a,uVar17,(uint32_t)local_110,&d,0xc6e00bf3,uVar20);
    uVar18 = d;
    uVar15 = local_150;
    uVar10 = (uint)local_b0;
    local_120 = (ulong)local_150;
    uVar10 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (int)local_90 +
             (uint32_t)local_f8 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_124 = d;
    local_a0 = (ulong)uVar21;
    Round(d,uVar23,uVar19,&g,local_150,uVar16,(uint32_t)local_130,&c,0xd5a79147,uVar10);
    uVar19 = c;
    uVar16 = g;
    uVar21 = (uint)local_c8;
    local_130 = (ulong)g;
    uVar21 = ((uint)(local_c8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_b0 +
             (uint32_t)local_e0 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_a8 = (ulong)uVar20;
    Round(c,uVar18,uVar23,&f,g,uVar15,(uint32_t)local_118,&b,0x6ca6351,uVar21);
    uVar23 = b;
    uVar15 = f;
    uVar20 = (uint)local_b8;
    local_110 = (ulong)f;
    uVar13 = ((uint)(local_b8 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_c8 +
             (uint32_t)local_d0 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_90 = (ulong)uVar10;
    Round(b,uVar19,local_124,&e,f,uVar16,(uint32_t)local_120,&a,0x14292967,uVar13);
    uVar18 = a;
    uVar16 = e;
    uVar20 = (uint)local_108;
    local_120 = (ulong)e;
    uVar10 = ((uint)(local_108 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_b8 +
             (int)local_88 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_118._0_4_ = a;
    local_b0 = (ulong)uVar21;
    Round(a,uVar23,uVar19,&d,e,uVar15,(uint32_t)local_130,&local_150,0x27b70a85,uVar10);
    uVar19 = d;
    uVar15 = local_150;
    uVar21 = (uint)local_100;
    local_130 = (ulong)d;
    uVar21 = ((uint)(local_100 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_108 +
             (int)local_98 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_c8 = (ulong)uVar13;
    Round(local_150,uVar18,uVar23,&c,d,uVar16,(uint32_t)local_110,&g,0x2e1b2138,uVar21);
    uVar23 = c;
    uVar16 = g;
    uVar20 = (uint)local_f0;
    local_110 = (ulong)c;
    uVar20 = ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) +
             (uint32_t)local_100 + (int)local_a0 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_b8 = (ulong)uVar10;
    Round(g,uVar15,(uint32_t)local_118,&b,c,uVar19,(uint32_t)local_120,&f,0x4d2c6dfc,uVar20);
    uVar18 = b;
    uVar19 = f;
    uVar10 = (uint)local_d8;
    local_120 = (ulong)b;
    uVar10 = ((uint)(local_d8 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (int)local_f0 +
             (int)local_a8 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_118._0_4_ = f;
    local_108 = (ulong)uVar21;
    Round(f,uVar16,uVar15,&a,b,uVar23,(uint32_t)local_130,&e,0x53380d13,uVar10);
    uVar17 = a;
    uVar23 = e;
    uVar21 = (uint)local_c0;
    local_130 = (ulong)a;
    uVar21 = ((uint)(local_c0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_d8 +
             (int)local_90 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_100 = (ulong)uVar20;
    Round(e,uVar19,uVar16,&local_150,a,uVar18,(uint32_t)local_110,&d,0x650a7354,uVar21);
    uVar19 = d;
    uVar15 = local_150;
    uVar20 = (uint)local_f8;
    local_110 = (ulong)local_150;
    uVar13 = ((uint)(local_f8 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_c0 +
             (int)local_b0 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_f0 = (ulong)uVar10;
    Round(d,uVar23,(uint32_t)local_118,&g,local_150,uVar17,(uint32_t)local_120,&c,0x766a0abb,uVar13)
    ;
    uVar18 = c;
    uVar16 = g;
    uVar20 = (uint)local_e0;
    local_120 = (ulong)g;
    uVar10 = ((uint)(local_e0 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (uint32_t)local_f8
             + (int)local_c8 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_118._0_4_ = c;
    local_d8 = (ulong)uVar21;
    Round(c,uVar19,uVar23,&f,g,uVar15,(uint32_t)local_130,&b,0x81c2c92e,uVar10);
    uVar17 = b;
    uVar15 = f;
    uVar21 = (uint)local_d0;
    local_130 = (ulong)f;
    uVar21 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_c0 = (ulong)uVar13;
    Round(b,uVar18,uVar19,&e,f,uVar16,(uint32_t)local_110,&a,0x92722c85,uVar21);
    uVar19 = a;
    uVar16 = e;
    uVar20 = (uint)local_88;
    local_110 = (ulong)e;
    uVar20 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (uint32_t)local_d0
             + (int)local_108 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_f8 = (ulong)uVar10;
    Round(a,uVar17,(uint32_t)local_118,&d,e,uVar15,(uint32_t)local_120,&local_150,0xa2bfe8a1,uVar20)
    ;
    uVar23 = d;
    uVar15 = local_150;
    uVar10 = (uint)local_98;
    uVar10 = ((uint)(local_98 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (int)local_88 +
             (uint32_t)local_100 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_120 = CONCAT44(local_120._4_4_,local_150);
    local_e0 = (ulong)uVar21;
    Round(local_150,uVar19,uVar17,&c,d,uVar16,(uint32_t)local_130,&g,0xa81a664b,uVar10);
    uVar18 = c;
    uVar16 = g;
    uVar21 = (uint)local_a0;
    local_130 = (ulong)c;
    uVar21 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_98 +
             (int)local_f0 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_118 = CONCAT44(local_118._4_4_,g);
    local_d0 = (ulong)uVar20;
    Round(g,uVar15,uVar19,&b,c,uVar23,(uint32_t)local_110,&f,0xc24b8b70,uVar21);
    uVar15 = b;
    uVar19 = f;
    uVar20 = (uint)local_a8;
    local_110 = (ulong)b;
    uVar13 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_a0 +
             (int)local_d8 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_88 = (ulong)uVar10;
    Round(f,uVar16,(uint32_t)local_120,&a,b,uVar18,uVar23,&e,0xc76c51a3,uVar13);
    uVar16 = a;
    uVar23 = e;
    uVar20 = (uint)local_90;
    local_120 = (ulong)a;
    uVar20 = ((uint)(local_90 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_a8 +
             (int)local_c0 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_98 = (ulong)uVar21;
    Round(e,uVar19,(uint32_t)local_118,&local_150,a,uVar15,(uint32_t)local_130,&d,0xd192e819,uVar20)
    ;
    uVar18 = d;
    uVar15 = local_150;
    uVar21 = (uint)local_b0;
    local_130 = (ulong)local_150;
    uVar10 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_90 +
             (uint32_t)local_f8 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_124 = d;
    local_a0 = (ulong)uVar13;
    Round(d,uVar23,uVar19,&g,local_150,uVar16,(uint32_t)local_110,&c,0xd6990624,uVar10);
    uVar19 = c;
    uVar16 = g;
    uVar21 = (uint)local_c8;
    local_110 = (ulong)g;
    uVar21 = ((uint)(local_c8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_b0 +
             (uint32_t)local_e0 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_a8 = (ulong)uVar20;
    Round(c,uVar18,uVar23,&f,g,uVar15,(uint32_t)local_120,&b,0xf40e3585,uVar21);
    uVar23 = b;
    uVar15 = f;
    uVar20 = (uint)local_b8;
    local_118 = (ulong)f;
    uVar20 = ((uint)(local_b8 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_c8 +
             (uint32_t)local_d0 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    local_80._0_4_ = b;
    local_90 = (ulong)uVar10;
    Round(b,uVar19,local_124,&e,f,uVar16,(uint32_t)local_130,&a,0x106aa070,uVar20);
    uVar16 = e;
    local_124 = a;
    uVar10 = (uint)local_108;
    local_120 = (ulong)e;
    uVar13 = ((uint)(local_108 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (int)local_b8 +
             (int)local_88 +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    local_b0 = (ulong)uVar21;
    Round(a,uVar23,uVar19,&d,e,uVar15,(uint32_t)local_110,&local_150,0x19a4c116,uVar13);
    uVar19 = local_124;
    uVar15 = local_150;
    uVar21 = (uint)local_100;
    local_130 = (ulong)d;
    uVar10 = ((uint)(local_100 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_108 +
             (int)local_98 +
             (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)
             );
    local_c8 = (ulong)uVar20;
    Round(local_150,local_124,(uint32_t)local_80,&c,d,uVar16,(uint32_t)local_118,&g,0x1e376c08,
          uVar10);
    uVar16 = c;
    local_80 = CONCAT44(local_80._4_4_,g);
    uVar21 = (uint)local_f0;
    local_108 = (ulong)c;
    uVar25 = ((uint)(local_f0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (uint32_t)local_100 + (int)local_a0 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    local_b8 = (ulong)uVar13;
    Round(g,uVar15,uVar19,&b,c,(uint32_t)local_130,(uint32_t)local_120,&f,0x2748774c,uVar25);
    uVar19 = b;
    local_100._0_4_ = f;
    uVar21 = (uint)local_d8;
    local_110 = (ulong)b;
    uVar13 = ((uint)(local_d8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_f0 +
             (int)local_a8 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             );
    uVar23 = (uint32_t)local_80;
    Round(f,(uint32_t)local_80,uVar15,&a,b,uVar16,(uint32_t)local_130,&e,0x34b0bcb5,uVar13);
    uVar15 = a;
    local_130._0_4_ = e;
    uVar21 = (uint)local_c0;
    local_118 = (ulong)a;
    uVar27 = ((uint)(local_c0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_d8 +
             (int)local_90 +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    Round(e,(uint32_t)local_100,uVar23,&local_150,a,uVar19,(uint32_t)local_108,&d,0x391c0cb3,uVar27)
    ;
    local_120 = CONCAT44(local_120._4_4_,d);
    uVar21 = (uint)local_f8;
    local_108 = (ulong)local_150;
    uVar29 = ((uint)(local_f8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_c0 +
             (int)local_b0 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    Round(d,(uint32_t)local_130,(uint32_t)local_100,&g,local_150,uVar15,(uint32_t)local_110,&c,
          0x4ed8aa4a,uVar29);
    local_100._0_4_ = c;
    uVar21 = (uint)local_e0;
    local_f0 = (ulong)g;
    uVar28 = ((uint)(local_e0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (uint32_t)local_f8
             + (int)local_c8 +
             (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11)
             );
    Round(c,(uint32_t)local_120,(uint32_t)local_130,&f,g,(uint32_t)local_108,(uint32_t)local_118,&b,
          0x5b9cca4f,uVar28);
    local_130 = CONCAT44(local_130._4_4_,b);
    uVar21 = (uint)local_d0;
    local_f8 = (ulong)f;
    uVar21 = ((uint)(local_d0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (uint32_t)local_e0
             + (int)local_b8 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    local_d8 = (ulong)uVar21;
    Round(b,(uint32_t)local_100,(uint32_t)local_120,&e,f,(uint32_t)local_f0,(uint32_t)local_108,&a,
          0x682e6ff3,uVar21);
    local_e0._0_4_ = a;
    uVar21 = (uint)local_88;
    local_108 = (ulong)e;
    uVar21 = ((uint)(local_88 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (uint32_t)local_d0
             + uVar10 +
             (uVar28 >> 10 ^ (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11)
             );
    local_c0 = (ulong)uVar21;
    Round(a,(uint32_t)local_130,(uint32_t)local_100,&d,e,(uint32_t)local_f8,(uint32_t)local_f0,
          &local_150,0x748f82ee,uVar21);
    local_100 = CONCAT44(local_100._4_4_,local_150);
    uVar21 = (uint)local_d8;
    uVar20 = (uint)local_98;
    local_f0 = (ulong)d;
    uVar20 = ((uint)(local_98 >> 3) & 0x1fffffff ^
             (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) + (int)local_88 +
             uVar25 + ((uint)(local_d8 >> 10) & 0x3fffff ^
                      (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11));
    Round(local_150,(uint32_t)local_e0,(uint32_t)local_130,&c,d,(uint32_t)local_108,
          (uint32_t)local_f8,&g,0x78a5636f,uVar20);
    local_d0 = CONCAT44(local_d0._4_4_,g);
    uVar21 = (uint)local_c0;
    uVar10 = (uint)local_a0;
    local_f8 = (ulong)c;
    uVar10 = ((uint)(local_a0 >> 3) & 0x1fffffff ^
             (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) + (int)local_98 +
             uVar13 + ((uint)(local_c0 >> 10) & 0x3fffff ^
                      (uVar21 << 0xd | uVar21 >> 0x13) ^ (uVar21 << 0xf | uVar21 >> 0x11));
    Round(g,(uint32_t)local_100,(uint32_t)local_e0,&b,c,(uint32_t)local_f0,(uint32_t)local_108,&f,
          0x84c87814,uVar10);
    uVar15 = f;
    uVar21 = (uint)local_a8;
    local_108 = (ulong)b;
    uVar20 = ((uint)(local_a8 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_a0 +
             uVar27 + (uVar20 >> 10 ^
                      (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
    local_e0 = CONCAT44(local_e0._4_4_,f);
    Round(f,(uint32_t)local_d0,(uint32_t)local_100,&a,b,(uint32_t)local_f8,(uint32_t)local_f0,&e,
          0x8cc70208,uVar20);
    uVar16 = a;
    uVar19 = e;
    uVar21 = (uint)local_90;
    local_f0 = (ulong)a;
    uVar10 = ((uint)(local_90 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_a8 +
             uVar29 + (uVar10 >> 10 ^
                      (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
    Round(e,uVar15,(uint32_t)local_d0,&local_150,a,(uint32_t)local_108,(uint32_t)local_f8,&d,
          0x90befffa,uVar10);
    uVar15 = local_150;
    local_f8 = CONCAT44(local_f8._4_4_,d);
    uVar21 = (uint)local_b0;
    uVar20 = ((uint)(local_b0 >> 3) & 0x1fffffff ^
             (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_90 +
             uVar28 + (uVar20 >> 10 ^
                      (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
    Round(d,uVar19,(uint32_t)local_e0,&g,local_150,uVar16,(uint32_t)local_108,&c,0xa4506ceb,uVar20);
    uVar23 = c;
    uVar16 = g;
    uVar21 = (uint)local_c8;
    Round(c,(uint32_t)local_f8,uVar19,&f,g,uVar15,(uint32_t)local_f0,&b,0xbef9a3f7,
          ((uint)(local_c8 >> 3) & 0x1fffffff ^
          (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_b0 +
          (int)local_d8 +
          (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)));
    uVar18 = b;
    uVar19 = f;
    uVar21 = (uint)local_b8;
    uVar17 = (uint32_t)local_f8;
    Round(b,uVar23,(uint32_t)local_f8,&e,f,uVar16,uVar15,&a,0xc67178f2,
          ((uint)(local_b8 >> 3) & 0x1fffffff ^
          (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) + (int)local_c8 +
          (int)local_c0 +
          (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11)));
    *local_60 = local_74 + a;
    local_60[1] = uVar18 + local_70;
    local_60[2] = uVar23 + local_6c;
    local_60[3] = uVar17 + local_68;
    local_60[4] = (int)local_50 + e;
    local_60[5] = uVar19 + (int)local_48;
    local_60[6] = uVar16 + (int)local_40;
    local_60[7] = uVar15 + local_64;
    chunk = local_e8 + 0x10;
  }
  return;
}

Assistant:

static void Transform(uint32_t *s, const uint32_t *chunk)
{
    uint32_t a1 = s[0], b1 = s[1], c1 = s[2], d1 = s[3], e1 = s[4];
    uint32_t a2 = a1, b2 = b1, c2 = c1, d2 = d1, e2 = e1;
    uint32_t w0 = le32_to_cpu(chunk[0]), w1 = le32_to_cpu(chunk[1]), w2 = le32_to_cpu(chunk[2]), w3 = le32_to_cpu(chunk[3]);
    uint32_t w4 = le32_to_cpu(chunk[4]), w5 = le32_to_cpu(chunk[5]), w6 = le32_to_cpu(chunk[6]), w7 = le32_to_cpu(chunk[7]);
    uint32_t w8 = le32_to_cpu(chunk[8]), w9 = le32_to_cpu(chunk[9]), w10 = le32_to_cpu(chunk[10]), w11 = le32_to_cpu(chunk[11]);
    uint32_t w12 = le32_to_cpu(chunk[12]), w13 = le32_to_cpu(chunk[13]), w14 = le32_to_cpu(chunk[14]), w15 = le32_to_cpu(chunk[15]);
    uint32_t t;

    R11(&a1, b1, &c1, d1, e1, w0, 11);
    R12(&a2, b2, &c2, d2, e2, w5, 8);
    R11(&e1, a1, &b1, c1, d1, w1, 14);
    R12(&e2, a2, &b2, c2, d2, w14, 9);
    R11(&d1, e1, &a1, b1, c1, w2, 15);
    R12(&d2, e2, &a2, b2, c2, w7, 9);
    R11(&c1, d1, &e1, a1, b1, w3, 12);
    R12(&c2, d2, &e2, a2, b2, w0, 11);
    R11(&b1, c1, &d1, e1, a1, w4, 5);
    R12(&b2, c2, &d2, e2, a2, w9, 13);
    R11(&a1, b1, &c1, d1, e1, w5, 8);
    R12(&a2, b2, &c2, d2, e2, w2, 15);
    R11(&e1, a1, &b1, c1, d1, w6, 7);
    R12(&e2, a2, &b2, c2, d2, w11, 15);
    R11(&d1, e1, &a1, b1, c1, w7, 9);
    R12(&d2, e2, &a2, b2, c2, w4, 5);
    R11(&c1, d1, &e1, a1, b1, w8, 11);
    R12(&c2, d2, &e2, a2, b2, w13, 7);
    R11(&b1, c1, &d1, e1, a1, w9, 13);
    R12(&b2, c2, &d2, e2, a2, w6, 7);
    R11(&a1, b1, &c1, d1, e1, w10, 14);
    R12(&a2, b2, &c2, d2, e2, w15, 8);
    R11(&e1, a1, &b1, c1, d1, w11, 15);
    R12(&e2, a2, &b2, c2, d2, w8, 11);
    R11(&d1, e1, &a1, b1, c1, w12, 6);
    R12(&d2, e2, &a2, b2, c2, w1, 14);
    R11(&c1, d1, &e1, a1, b1, w13, 7);
    R12(&c2, d2, &e2, a2, b2, w10, 14);
    R11(&b1, c1, &d1, e1, a1, w14, 9);
    R12(&b2, c2, &d2, e2, a2, w3, 12);
    R11(&a1, b1, &c1, d1, e1, w15, 8);
    R12(&a2, b2, &c2, d2, e2, w12, 6);

    R21(&e1, a1, &b1, c1, d1, w7, 7);
    R22(&e2, a2, &b2, c2, d2, w6, 9);
    R21(&d1, e1, &a1, b1, c1, w4, 6);
    R22(&d2, e2, &a2, b2, c2, w11, 13);
    R21(&c1, d1, &e1, a1, b1, w13, 8);
    R22(&c2, d2, &e2, a2, b2, w3, 15);
    R21(&b1, c1, &d1, e1, a1, w1, 13);
    R22(&b2, c2, &d2, e2, a2, w7, 7);
    R21(&a1, b1, &c1, d1, e1, w10, 11);
    R22(&a2, b2, &c2, d2, e2, w0, 12);
    R21(&e1, a1, &b1, c1, d1, w6, 9);
    R22(&e2, a2, &b2, c2, d2, w13, 8);
    R21(&d1, e1, &a1, b1, c1, w15, 7);
    R22(&d2, e2, &a2, b2, c2, w5, 9);
    R21(&c1, d1, &e1, a1, b1, w3, 15);
    R22(&c2, d2, &e2, a2, b2, w10, 11);
    R21(&b1, c1, &d1, e1, a1, w12, 7);
    R22(&b2, c2, &d2, e2, a2, w14, 7);
    R21(&a1, b1, &c1, d1, e1, w0, 12);
    R22(&a2, b2, &c2, d2, e2, w15, 7);
    R21(&e1, a1, &b1, c1, d1, w9, 15);
    R22(&e2, a2, &b2, c2, d2, w8, 12);
    R21(&d1, e1, &a1, b1, c1, w5, 9);
    R22(&d2, e2, &a2, b2, c2, w12, 7);
    R21(&c1, d1, &e1, a1, b1, w2, 11);
    R22(&c2, d2, &e2, a2, b2, w4, 6);
    R21(&b1, c1, &d1, e1, a1, w14, 7);
    R22(&b2, c2, &d2, e2, a2, w9, 15);
    R21(&a1, b1, &c1, d1, e1, w11, 13);
    R22(&a2, b2, &c2, d2, e2, w1, 13);
    R21(&e1, a1, &b1, c1, d1, w8, 12);
    R22(&e2, a2, &b2, c2, d2, w2, 11);

    R31(&d1, e1, &a1, b1, c1, w3, 11);
    R32(&d2, e2, &a2, b2, c2, w15, 9);
    R31(&c1, d1, &e1, a1, b1, w10, 13);
    R32(&c2, d2, &e2, a2, b2, w5, 7);
    R31(&b1, c1, &d1, e1, a1, w14, 6);
    R32(&b2, c2, &d2, e2, a2, w1, 15);
    R31(&a1, b1, &c1, d1, e1, w4, 7);
    R32(&a2, b2, &c2, d2, e2, w3, 11);
    R31(&e1, a1, &b1, c1, d1, w9, 14);
    R32(&e2, a2, &b2, c2, d2, w7, 8);
    R31(&d1, e1, &a1, b1, c1, w15, 9);
    R32(&d2, e2, &a2, b2, c2, w14, 6);
    R31(&c1, d1, &e1, a1, b1, w8, 13);
    R32(&c2, d2, &e2, a2, b2, w6, 6);
    R31(&b1, c1, &d1, e1, a1, w1, 15);
    R32(&b2, c2, &d2, e2, a2, w9, 14);
    R31(&a1, b1, &c1, d1, e1, w2, 14);
    R32(&a2, b2, &c2, d2, e2, w11, 12);
    R31(&e1, a1, &b1, c1, d1, w7, 8);
    R32(&e2, a2, &b2, c2, d2, w8, 13);
    R31(&d1, e1, &a1, b1, c1, w0, 13);
    R32(&d2, e2, &a2, b2, c2, w12, 5);
    R31(&c1, d1, &e1, a1, b1, w6, 6);
    R32(&c2, d2, &e2, a2, b2, w2, 14);
    R31(&b1, c1, &d1, e1, a1, w13, 5);
    R32(&b2, c2, &d2, e2, a2, w10, 13);
    R31(&a1, b1, &c1, d1, e1, w11, 12);
    R32(&a2, b2, &c2, d2, e2, w0, 13);
    R31(&e1, a1, &b1, c1, d1, w5, 7);
    R32(&e2, a2, &b2, c2, d2, w4, 7);
    R31(&d1, e1, &a1, b1, c1, w12, 5);
    R32(&d2, e2, &a2, b2, c2, w13, 5);

    R41(&c1, d1, &e1, a1, b1, w1, 11);
    R42(&c2, d2, &e2, a2, b2, w8, 15);
    R41(&b1, c1, &d1, e1, a1, w9, 12);
    R42(&b2, c2, &d2, e2, a2, w6, 5);
    R41(&a1, b1, &c1, d1, e1, w11, 14);
    R42(&a2, b2, &c2, d2, e2, w4, 8);
    R41(&e1, a1, &b1, c1, d1, w10, 15);
    R42(&e2, a2, &b2, c2, d2, w1, 11);
    R41(&d1, e1, &a1, b1, c1, w0, 14);
    R42(&d2, e2, &a2, b2, c2, w3, 14);
    R41(&c1, d1, &e1, a1, b1, w8, 15);
    R42(&c2, d2, &e2, a2, b2, w11, 14);
    R41(&b1, c1, &d1, e1, a1, w12, 9);
    R42(&b2, c2, &d2, e2, a2, w15, 6);
    R41(&a1, b1, &c1, d1, e1, w4, 8);
    R42(&a2, b2, &c2, d2, e2, w0, 14);
    R41(&e1, a1, &b1, c1, d1, w13, 9);
    R42(&e2, a2, &b2, c2, d2, w5, 6);
    R41(&d1, e1, &a1, b1, c1, w3, 14);
    R42(&d2, e2, &a2, b2, c2, w12, 9);
    R41(&c1, d1, &e1, a1, b1, w7, 5);
    R42(&c2, d2, &e2, a2, b2, w2, 12);
    R41(&b1, c1, &d1, e1, a1, w15, 6);
    R42(&b2, c2, &d2, e2, a2, w13, 9);
    R41(&a1, b1, &c1, d1, e1, w14, 8);
    R42(&a2, b2, &c2, d2, e2, w9, 12);
    R41(&e1, a1, &b1, c1, d1, w5, 6);
    R42(&e2, a2, &b2, c2, d2, w7, 5);
    R41(&d1, e1, &a1, b1, c1, w6, 5);
    R42(&d2, e2, &a2, b2, c2, w10, 15);
    R41(&c1, d1, &e1, a1, b1, w2, 12);
    R42(&c2, d2, &e2, a2, b2, w14, 8);

    R51(&b1, c1, &d1, e1, a1, w4, 9);
    R52(&b2, c2, &d2, e2, a2, w12, 8);
    R51(&a1, b1, &c1, d1, e1, w0, 15);
    R52(&a2, b2, &c2, d2, e2, w15, 5);
    R51(&e1, a1, &b1, c1, d1, w5, 5);
    R52(&e2, a2, &b2, c2, d2, w10, 12);
    R51(&d1, e1, &a1, b1, c1, w9, 11);
    R52(&d2, e2, &a2, b2, c2, w4, 9);
    R51(&c1, d1, &e1, a1, b1, w7, 6);
    R52(&c2, d2, &e2, a2, b2, w1, 12);
    R51(&b1, c1, &d1, e1, a1, w12, 8);
    R52(&b2, c2, &d2, e2, a2, w5, 5);
    R51(&a1, b1, &c1, d1, e1, w2, 13);
    R52(&a2, b2, &c2, d2, e2, w8, 14);
    R51(&e1, a1, &b1, c1, d1, w10, 12);
    R52(&e2, a2, &b2, c2, d2, w7, 6);
    R51(&d1, e1, &a1, b1, c1, w14, 5);
    R52(&d2, e2, &a2, b2, c2, w6, 8);
    R51(&c1, d1, &e1, a1, b1, w1, 12);
    R52(&c2, d2, &e2, a2, b2, w2, 13);
    R51(&b1, c1, &d1, e1, a1, w3, 13);
    R52(&b2, c2, &d2, e2, a2, w13, 6);
    R51(&a1, b1, &c1, d1, e1, w8, 14);
    R52(&a2, b2, &c2, d2, e2, w14, 5);
    R51(&e1, a1, &b1, c1, d1, w11, 11);
    R52(&e2, a2, &b2, c2, d2, w0, 15);
    R51(&d1, e1, &a1, b1, c1, w6, 8);
    R52(&d2, e2, &a2, b2, c2, w3, 13);
    R51(&c1, d1, &e1, a1, b1, w15, 5);
    R52(&c2, d2, &e2, a2, b2, w9, 11);
    R51(&b1, c1, &d1, e1, a1, w13, 6);
    R52(&b2, c2, &d2, e2, a2, w11, 11);

    t = s[0];
    s[0] = s[1] + c1 + d2;
    s[1] = s[2] + d1 + e2;
    s[2] = s[3] + e1 + a2;
    s[3] = s[4] + a1 + b2;
    s[4] = t + b1 + c2;
}